

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O3

Error asmjit::_abi_1_10::x86::InstInternal::validate
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,
                ValidationFlags validationFlags)

{
  byte bVar1;
  InstOptions IVar2;
  uint uVar3;
  BaseInst *pBVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  InstInfo *pIVar10;
  ulong uVar11;
  Operand_ *pOVar13;
  OpSignature *pOVar14;
  ulong extraout_RAX;
  ulong uVar15;
  undefined1 *extraout_RDX;
  InstSignature *this;
  uint uVar16;
  size_t index;
  OpSignature ref;
  undefined7 in_register_00000039;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  ulong uStack_f0;
  bool localImmOutOfRange;
  ulong local_d8;
  Operand_ *local_d0;
  byte local_c1;
  Operand_ *local_c0;
  ulong local_b8;
  ulong local_b0;
  InstSignature *local_a8;
  InstOptions local_9c;
  ulong local_98;
  InstOptions local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  BaseInst *local_78;
  undefined1 *local_70;
  OpSignature oSigTranslated [6];
  ulong uVar12;
  
  local_b0 = CONCAT44(local_b0._4_4_,validationFlags);
  local_98 = CONCAT71(in_register_00000039,arch) & 0xffffffff;
  if (1 < (byte)(arch - k32BitMask)) {
    validate();
LAB_00142eaa:
    uStack_f0 = 0x24;
    goto LAB_00142ebd;
  }
  bVar20 = (char)local_98 == '\x01';
  local_70 = _x64ValidationData;
  if (bVar20) {
    local_70 = _x86ValidationData;
  }
  if (inst->_id < 0x67f) {
    IVar2 = inst->_options;
    pIVar10 = InstDB::infoById((InstDB *)(ulong)inst->_id,(InstId)inst);
    local_b8 = (ulong)(*(uint *)pIVar10 >> 0xe & 0x3ff);
    local_88 = *(uint *)(InstDB::_commonInfoTable + local_b8 * 8);
    if ((IVar2 & (kX86_XRelease|kX86_XAcquire|kX86_Lock)) != kNone) {
      if ((IVar2 >> 0xd & 1) == 0) {
        if ((IVar2 & (kX86_XRelease|kX86_XAcquire)) != kNone) {
LAB_0014257e:
          uStack_f0 = 0x20;
          goto LAB_00142ebd;
        }
      }
      else {
        uStack_f0 = 0x21;
        if ((local_88 >> 0x10 & 1) == 0) {
          if ((opCount == 0) || ((IVar2 & (kX86_XRelease|kX86_XAcquire)) == kNone))
          goto LAB_00142ebd;
        }
        else if (opCount == 0) goto LAB_00142ebd;
        if (((operands->_signature)._bits & 7) != 2) goto LAB_00142ebd;
        if ((IVar2 & (kX86_XRelease|kX86_XAcquire)) != kNone) {
          if ((IVar2 & (kX86_XRelease|kX86_XAcquire)) == (kX86_XRelease|kX86_XAcquire))
          goto LAB_0014257e;
          if (((IVar2 >> 0x10 & 1) != 0) && ((local_88 & 0x20000) == 0)) {
            uStack_f0 = 0x22;
            goto LAB_00142ebd;
          }
          if (((IVar2 >> 0x11 & 1) != 0) && ((local_88 & 0x40000) == 0)) {
            uStack_f0 = 0x23;
            goto LAB_00142ebd;
          }
        }
      }
    }
    local_9c = IVar2 & (kX86_Repne|kX86_Rep);
    if (local_9c != kNone) {
      uStack_f0 = 0x20;
      if (local_9c == (kX86_Repne|kX86_Rep)) goto LAB_00142ebd;
      if ((local_88 >> 0xe & 1) == 0) goto LAB_00142eaa;
    }
    local_c1 = 2 - bVar20;
    local_84 = 0xc6;
    if ((char)local_98 == '\x01') {
      local_84 = 0x66;
    }
    local_80 = 0x70c0;
    if ((char)local_98 == '\x01') {
      local_80 = 0x7060;
    }
    uVar18 = 0;
    local_d0 = (Operand_ *)0x0;
    uVar9 = 0;
    uVar7 = 0;
    local_d8 = opCount;
    local_c0 = operands;
    local_8c = IVar2;
    local_78 = inst;
    while( true ) {
      ref = (OpSignature)0xffffffffffffff;
      uVar19 = (ulong)uVar7;
      uVar11 = opCount;
      if (opCount <= uVar19) break;
      uVar17 = operands[uVar19]._signature._bits;
      uStack_f0 = 3;
      if (4 < (uVar17 & 7)) goto LAB_00142ebd;
      pOVar13 = operands + uVar19;
      uVar12 = 0;
      uVar11 = 0;
      switch(uVar17 & 7) {
      case 0:
        pOVar13 = operands + opCount;
        uStack_f0 = 0x1a;
        goto LAB_00142b5e;
      case 1:
        uVar17 = uVar17 >> 3 & 0x1f;
        if ((0xfe018f07U >> uVar17 & 1) == 0) {
          uVar15 = *(ulong *)(_x86OpFlagFromRegType + (ulong)uVar17 * 8);
          uVar16 = pOVar13->_baseId;
          if (uVar16 < 0x100) {
            if (uVar16 < 0x20) {
              uVar8 = 1 << ((byte)uVar16 & 0x1f);
              uVar11 = (ulong)uVar8;
              if ((*(uint *)(local_70 + (ulong)uVar17 * 4) >> (uVar16 & 0x1f) & 1) != 0) {
                uVar9 = uVar9 | uVar8;
                break;
              }
            }
LAB_00142e99:
            uStack_f0 = 0x1d;
          }
          else {
            uVar11 = 0xffffffffffffffff;
            if ((local_b0 & 1) != 0) break;
LAB_00142d5b:
            uStack_f0 = 0x3e;
          }
        }
        else {
          uStack_f0 = 0x1b;
        }
        goto LAB_00142ebd;
      case 2:
        if ((~uVar17 & 0x1c0000) == 0) {
          uStack_f0 = 0x31;
          goto LAB_00142ebd;
        }
        uVar16 = uVar17 >> 0x18;
        if ((uVar17 & 0xe00000) != 0) {
          uVar8 = *(uint *)(InstDB::_commonInfoTable + local_b8 * 8 + 4);
          if (uVar17 < 0x1000000) {
            uVar16 = 8;
            if ((uVar8 & 0x40) == 0) {
              uVar16 = ((uVar8 & 0x20) >> 4) + 2;
            }
          }
          else if (((uVar16 != 4) && ((uVar8 & 0x20) != 0)) ||
                  ((uVar16 != 8 && ((uVar8 & 0x40) != 0)))) {
            uStack_f0 = 0x29;
            goto LAB_00142ebd;
          }
          uVar16 = uVar16 << ((byte)(uVar17 >> 0x15) & 7);
        }
        bVar5 = (byte)uVar17;
        local_a8 = (InstSignature *)CONCAT71(local_a8._1_7_,bVar5 >> 3);
        uVar8 = uVar17 >> 8;
        bVar6 = (byte)(uVar17 >> 8) & 0x1f;
        if (bVar5 < 8) {
          local_d0 = (Operand_ *)CONCAT44(local_d0._4_4_,uVar9);
          local_7c = uVar16;
          uVar11 = BaseMem::offset((BaseMem *)pOVar13);
          uVar9 = (uint)local_d0;
          uVar16 = local_7c;
          if ((long)(int)uVar11 == uVar11) {
LAB_001428df:
            if ((uVar8 & 0x1f) != 0) {
LAB_00142956:
              if ((local_80 >> (uVar8 & 0x1f) & 1) == 0) goto LAB_00142db5;
              bVar6 = bVar6 - 0xc;
              if (bVar6 < 3) {
                uVar15 = *(ulong *)(&DAT_0015f9c0 + (ulong)bVar6 * 8);
LAB_001429a1:
                if (((char)local_a8 == '\x02') && ((uVar15 & 0xfc0000000) != 0)) goto LAB_00142db5;
              }
              else {
                uVar15 = 0x8000000000000;
                if (7 < bVar5) goto LAB_001429a1;
                uVar15 = 0;
              }
              uVar17 = pOVar13->_data[0];
              if (uVar17 < 0x100) {
                if (0x1f < uVar17) goto LAB_00142e99;
                uVar9 = uVar9 | 1 << (uVar17 & 0x1f);
                uVar11 = 0;
              }
              else {
                uVar11 = 0;
                if ((local_b0 & 1) == 0) goto LAB_00142d5b;
              }
              goto LAB_00142a17;
            }
          }
          else {
            if ((char)local_98 == '\x01') {
              if (uVar11 >> 0x20 != 0) goto LAB_00142e6f;
              goto LAB_001428df;
            }
            if ((uVar8 & 0x1f) != 0) {
              if (uVar11 >> 0x20 == 0) {
                if (bVar6 == 6) goto LAB_00142956;
                uStack_f0 = 0x2f;
              }
              else {
LAB_00142e6f:
                uStack_f0 = 0x2e;
              }
              goto LAB_00142ebd;
            }
          }
          uVar15 = 0;
          uVar11 = 0;
        }
        else {
          if (bVar5 < 0x10) goto LAB_001428df;
          uVar3 = pOVar13->_baseId;
          if (((uVar17 >> 0xd & 1) == 0) && ((local_84 >> (bVar5 >> 3) & 1) == 0)) {
LAB_00142db5:
            uStack_f0 = 0x2b;
            goto LAB_00142ebd;
          }
          if (uVar3 < 0x100) {
            if (0x1f < uVar3) goto LAB_00142e99;
            uVar11 = (ulong)(uint)(1 << ((byte)uVar3 & 0x1f));
            uVar9 = uVar9 | 1 << (uVar3 & 0x1f);
          }
          else {
            uVar11 = 0xffffffffffffffff;
            if ((local_b0 & 1) == 0) goto LAB_00142d5b;
          }
          if ((uVar8 & 0x1f) != 0) goto LAB_00142956;
          uVar15 = (ulong)(pOVar13->_data[1] == 0) << 0x30;
        }
LAB_00142a17:
        opCount = local_d8;
        operands = local_c0;
        local_d0 = pOVar13;
        switch(uVar16) {
        case 0:
          uVar15 = uVar15 | 0x40000;
          break;
        case 1:
          uVar15 = uVar15 | 0x80000;
          break;
        case 2:
          uVar15 = uVar15 | 0x100000;
          break;
        case 3:
        case 5:
        case 7:
        case 9:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0xe:
        case 0xf:
switchD_00142a2c_caseD_3:
          uStack_f0 = 0x33;
          goto LAB_00142ebd;
        case 4:
          uVar15 = uVar15 | 0x200000;
          break;
        case 6:
          uVar15 = uVar15 | 0x400000;
          break;
        case 8:
          uVar15 = uVar15 | 0x800000;
          break;
        case 10:
          uVar15 = uVar15 | 0x1000000;
          break;
        case 0x10:
          uVar15 = uVar15 | 0x2000000;
          break;
        default:
          if (uVar16 == 0x20) {
            uVar15 = uVar15 | 0x4000000;
          }
          else {
            if (uVar16 != 0x40) goto switchD_00142a2c_caseD_3;
            uVar15 = uVar15 | 0x8000000;
          }
        }
        break;
      case 3:
        uVar15 = *(ulong *)pOVar13->_data;
        if ((long)uVar15 < 0) {
          uVar15 = -uVar15;
          if (uVar15 < 9) {
            uVar15 = 0x155000000000;
          }
          else if (uVar15 < 0x81) {
            uVar15 = 0x154000000000;
          }
          else if (uVar15 < 0x8001) {
            uVar15 = 0x150000000000;
          }
          else {
            uVar15 = ((ulong)(uVar15 < 0x80000001) | 4) << 0x2a;
          }
        }
        else if (uVar15 < 8) {
          uVar15 = 0x3ff000000000;
          uVar11 = uVar12;
        }
        else if (uVar15 < 0x10) {
          uVar15 = 0x3fe000000000;
          uVar11 = uVar12;
        }
        else if (uVar15 < 0x80) {
          uVar15 = 0x3fc000000000;
          uVar11 = uVar12;
        }
        else if (uVar15 < 0x100) {
          uVar15 = 0x3f8000000000;
        }
        else if (uVar15 < 0x8000) {
          uVar15 = 0x3f0000000000;
        }
        else if (uVar15 < 0x10000) {
          uVar15 = 0x3e0000000000;
        }
        else if (uVar15 < 0x80000000) {
          uVar15 = 0x3c0000000000;
        }
        else {
          uVar15 = ((ulong)(uVar15 >> 0x20 == 0) | 6) << 0x2b;
        }
        break;
      case 4:
        uVar15 = 0xc00000000000;
        uVar11 = uVar12;
      }
      oSigTranslated[uVar19] = (OpSignature)(uVar11 << 0x38 | uVar15 & 0xffffffffffffff);
      uVar18 = uVar18 | uVar15;
      uVar7 = uVar7 + 1;
    }
LAB_00142b77:
    if ((char)local_98 == '\x01') {
      if ((uVar18 & 0x10) != 0) {
        uStack_f0 = 0x3a;
        goto LAB_00142ebd;
      }
    }
    else if (((byte)(0xff < uVar9 | (*(byte *)((long)&local_78->_options + 3) & 0x40) >> 6) == 1) &&
            ((uVar18 & 2) != 0)) {
      uStack_f0 = 0x39;
      goto LAB_00142ebd;
    }
    uVar9 = *(uint *)(InstDB::_commonInfoTable + local_b8 * 8 + 4) >> 0x16 & 0x1f;
    if (uVar9 != 0) {
      this = (InstSignature *)
             (InstDB::_instSignatureTable +
             (*(uint *)(InstDB::_commonInfoTable + local_b8 * 8 + 4) >> 8 & 0x3ff8));
      local_a8 = this + uVar9;
      bVar5 = 0;
      bVar6 = 0;
      local_d8 = uVar11;
      do {
        bVar1 = *(byte *)this;
        if ((local_c1 & bVar1 >> 3) != 0) {
          uVar9 = bVar1 & 7;
          localImmOutOfRange = false;
          if (uVar11 == uVar9) {
            for (uVar18 = 0; (uint)uVar18 < (uint)uVar11; uVar18 = uVar18 + 1) {
              pOVar14 = InstDB::InstSignature::opSignature(this,uVar18);
              ref = *pOVar14;
              bVar20 = x86CheckOSig((OpSignature *)oSigTranslated[uVar18],(OpSignature *)ref,
                                    &localImmOutOfRange);
              if (!bVar20) break;
            }
          }
          else {
            uVar18 = 0;
            if (uVar11 == uVar9 - (bVar1 >> 5)) {
              uVar18 = 0;
              uVar7 = 0;
              while ((uVar11 = local_d8, operands = local_c0, uVar18 < local_d8 && (uVar7 < uVar9)))
              {
                index = (size_t)uVar7;
                local_b0 = uVar18;
                while( true ) {
                  bVar6 = InstDB::InstSignature::opSignatureIndex(this,index);
                  ref = *(OpSignature *)(InstDB::_opSignatureTable + (ulong)bVar6 * 8);
                  if (((ulong)ref >> 0x37 & 1) == 0) break;
                  index = index + 1;
                  uVar11 = local_d8;
                  operands = local_c0;
                  if (uVar9 <= index) goto LAB_00142cd9;
                }
                bVar20 = x86CheckOSig((OpSignature *)oSigTranslated[local_b0],(OpSignature *)ref,
                                      &localImmOutOfRange);
                uVar11 = local_d8;
                operands = local_c0;
                if (!bVar20) break;
                uVar18 = (ulong)((int)uVar18 + 1);
                uVar7 = (int)index + 1;
              }
            }
          }
LAB_00142cd9:
          bVar20 = uVar11 == (uVar18 & 0xffffffff);
          bVar6 = bVar5;
          if (bVar20) {
            bVar6 = localImmOutOfRange;
          }
          bVar5 = bVar6;
          if ((localImmOutOfRange & 1U) == 0 && bVar20) {
            if (this != local_a8) goto LAB_00142d20;
            break;
          }
        }
        this = this + 1;
      } while (this != local_a8);
      uStack_f0 = 0x1a;
      if ((bVar6 & 1) != 0) {
        uStack_f0 = 0x32;
      }
      goto LAB_00142ebd;
    }
LAB_00142d20:
    pBVar4 = local_78;
    uVar9 = local_88;
    if ((local_8c & (kX86_ZMask|kX86_SAE|kX86_ER)) != kNone) {
      if ((InstDB::_commonInfoTable[local_b8 * 8 + 2] & 0x80) == 0) goto LAB_00142d4d;
      if (((local_8c >> 0x17 & 1) != 0) && ((InstDB::_commonInfoTable[local_b8 * 8 + 4] & 2) == 0))
      {
        uStack_f0 = 0x28;
        goto LAB_00142ebd;
      }
      if ((local_8c & (kX86_SAE|kX86_ER)) != kNone) {
        uStack_f0 = 0x2a;
        if (local_d0 != (Operand_ *)0x0) goto LAB_00142ebd;
        uVar7 = *(uint *)(InstDB::_commonInfoTable + local_b8 * 8 + 4);
        if ((local_8c >> 0x12 & 1) == 0) {
          uVar17 = uVar7 & 8;
        }
        else {
          uVar17 = uVar7 & 4;
        }
        if (uVar17 == 0) goto LAB_00142ebd;
        if ((uVar7 & 0x70) != 0) {
          if (uVar11 < 2) {
            validate();
            if ((uint)uStack_f0 < 0x67f) {
              return (int)((uStack_f0 & 0xffffffff) << 3) + 0x155070;
            }
            InstDB::infoById();
            uVar18 = (ulong)ref & uStack_f0;
            if ((uVar18 & 0xffffdffcffff) == 0) {
              if (((ulong)ref & 0x3ff000000000) != 0 && (uStack_f0 & 0x3ff000000000) != 0) {
                *extraout_RDX = 1;
                return 1;
              }
            }
            else if ((((uStack_f0 & 0x1000000000000) != 0) || (((ulong)ref & 0x1000000000000) == 0))
                    || ((uVar18 & 0x1ffc0000) == 0)) {
              return (Error)(uVar18 >> 0x38 != 0 ||
                            ((ulong)ref < 0x100000000000000 || (short)uVar18 == 0));
            }
            return 0;
          }
          uStack_f0 = 0x2a;
          validate((InstInternal *)operands);
          if ((extraout_RAX & 1) == 0) goto LAB_00142ebd;
        }
      }
    }
    uVar7 = (pBVar4->_extraReg)._signature._bits;
    uStack_f0 = 0;
    if (uVar7 != 0) {
      if (local_9c == kNone) {
        uStack_f0 = 0x26;
        if ((((uVar7 & 0xf8) == 0x88) &&
            ((*(uint *)(InstDB::_commonInfoTable + local_b8 * 8) & 0x800000) != 0)) &&
           (((pBVar4->_extraReg)._id == 0 ||
            (uStack_f0 = 0, (InstDB::_commonInfoTable[local_b8 * 8 + 4] & 1) == 0)))) {
          uStack_f0 = 0x27;
        }
      }
      else if ((((short)uVar9 < 0) || (uVar9 = (pBVar4->_extraReg)._id, uVar9 < 0xff && uVar9 != 1))
              || ((local_d0 == (Operand_ *)0x0 ||
                  (uStack_f0 = 0, ((uVar7 ^ (local_d0->_signature)._bits) & 0xf8) != 0)))) {
        uStack_f0 = 0x26;
      }
    }
  }
  else {
LAB_00142d4d:
    uStack_f0 = 0x1a;
  }
LAB_00142ebd:
  return (Error)uStack_f0;
  while ((pOVar13->_signature)._bits == 0) {
LAB_00142b5e:
    pOVar13 = pOVar13 + -1;
    opCount = opCount - 1;
    uVar11 = uVar19;
    if (opCount <= uVar19) goto LAB_00142b77;
  }
  goto LAB_00142ebd;
}

Assistant:

ASMJIT_FAVOR_SIZE Error InstInternal::validate(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, ValidationFlags validationFlags) noexcept {
  // Only called when `arch` matches X86 family.
  ASMJIT_ASSERT(Environment::isFamilyX86(arch));

  const X86ValidationData* vd;
  if (arch == Arch::kX86)
    vd = &_x86ValidationData;
  else
    vd = &_x64ValidationData;

  uint32_t i;
  InstDB::Mode mode = InstDB::modeFromArch(arch);

  // Get the instruction data.
  InstId instId = inst.id();
  InstOptions options = inst.options();

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(instId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
  const InstDB::CommonInfo& commonInfo = instInfo.commonInfo();

  InstDB::InstFlags iFlags = instInfo.flags();

  constexpr InstOptions kRepAny = InstOptions::kX86_Rep | InstOptions::kX86_Repne;
  constexpr InstOptions kXAcqXRel = InstOptions::kX86_XAcquire | InstOptions::kX86_XRelease;
  constexpr InstOptions kAvx512Options = InstOptions::kX86_ZMask | InstOptions::kX86_ER | InstOptions::kX86_SAE;

  // Validate LOCK|XACQUIRE|XRELEASE Prefixes
  // ----------------------------------------

  if (Support::test(options, InstOptions::kX86_Lock | kXAcqXRel)) {
    if (Support::test(options, InstOptions::kX86_Lock)) {
      if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kLock) && !Support::test(options, kXAcqXRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(opCount < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (Support::test(options, kXAcqXRel)) {
      if (ASMJIT_UNLIKELY(!Support::test(options, InstOptions::kX86_Lock) || (options & kXAcqXRel) == kXAcqXRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XAcquire) && !Support::test(iFlags, InstDB::InstFlags::kXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XRelease) && !Support::test(iFlags, InstDB::InstFlags::kXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNE Prefixes
  // -------------------------------

  if (Support::test(options, kRepAny)) {
    if (ASMJIT_UNLIKELY((options & kRepAny) == kRepAny))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);
  }

  // Translate Each Operand to the Corresponding OpSignature
  // -------------------------------------------------------

  InstDB::OpSignature oSigTranslated[Globals::kMaxOpCount];
  InstDB::OpFlags combinedOpFlags = InstDB::OpFlags::kNone;
  uint32_t combinedRegMask = 0;
  const Mem* memOp = nullptr;

  for (i = 0; i < opCount; i++) {
    const Operand_& op = operands[i];
    if (op.opType() == OperandType::kNone)
      break;

    InstDB::OpFlags opFlags = InstDB::OpFlags::kNone;
    RegMask regMask = 0;

    switch (op.opType()) {
      case OperandType::kReg: {
        RegType regType = op.as<BaseReg>().type();
        opFlags = _x86OpFlagFromRegType[size_t(regType)];

        if (ASMJIT_UNLIKELY(opFlags == InstDB::OpFlags::kNone))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kVirtIdMin it means that the register is virtual and its
        // index will be assigned later by the register allocator. We must pass unless asked to disallow virtual
        // registers.
        uint32_t regId = op.id();
        if (regId < Operand::kVirtIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          if (ASMJIT_UNLIKELY(Support::bitTest(vd->allowedRegMask[size_t(regType)], regId) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Support::bitMask(regId);
          combinedRegMask |= regMask;
        }
        else {
          if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
            return DebugUtils::errored(kErrorIllegalVirtReg);
          regMask = 0xFFFFFFFFu;
        }
        break;
      }

      // TODO: Validate base and index and combine these with `combinedRegMask`.
      case OperandType::kMem: {
        const Mem& m = op.as<Mem>();
        memOp = &m;

        uint32_t memSize = m.size();
        RegType baseType = m.baseType();
        RegType indexType = m.indexType();

        if (m.segmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        // Validate AVX-512 broadcast {1tox}.
        if (m.hasBroadcast()) {
          if (memSize != 0) {
            // If the size is specified it has to match the broadcast size.
            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B32() && memSize != 4))
              return DebugUtils::errored(kErrorInvalidBroadcast);

            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B64() && memSize != 8))
              return DebugUtils::errored(kErrorInvalidBroadcast);
          }
          else {
            // If there is no size we implicitly calculate it so we can validate N in {1toN} properly.
            memSize = commonInfo.hasAvx512B64() ? 8 :
                      commonInfo.hasAvx512B32() ? 4 : 2;
          }

          memSize <<= uint32_t(m.getBroadcast());
        }

        if (baseType != RegType::kNone && baseType > RegType::kLabelTag) {
          uint32_t baseId = m.baseId();

          if (m.isRegHome()) {
            // Home address of a virtual register. In such case we don't want to validate the type of the
            // base register as it will always be patched to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemBaseRegs, baseType)))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit memory operand. Basically
          // only usable for string instructions and other instructions where memory operand is implicit and
          // has 'seg:[reg]' form.
          if (baseId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(baseId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            // Physical base id.
            regMask = Support::bitMask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - fill the whole mask for implicit mem validation. The register is not assigned
            // yet, so we cannot predict the phys id.
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
            regMask = 0xFFFFFFFFu;
          }

          if (indexType == RegType::kNone && !m.offsetLo32())
            opFlags |= InstDB::OpFlags::kFlagMemBase;
        }
        else if (baseType == RegType::kLabelTag) {
          // [Label] - there is no need to validate the base as it's label.
        }
        else {
          // Base is a 64-bit address.
          int64_t offset = m.offset();
          if (!Support::isInt32(offset)) {
            if (mode == InstDB::Mode::kX86) {
              // 32-bit mode: Make sure that the address is either `int32_t` or `uint32_t`.
              if (!Support::isUInt32(offset))
                return DebugUtils::errored(kErrorInvalidAddress64Bit);
            }
            else {
              // 64-bit mode: Zero extension is allowed if the address has 32-bit index register or the address
              // has no index register (it's still encodable).
              if (indexType != RegType::kNone) {
                if (!Support::isUInt32(offset))
                  return DebugUtils::errored(kErrorInvalidAddress64Bit);

                if (indexType != RegType::kX86_Gpd)
                  return DebugUtils::errored(kErrorInvalidAddress64BitZeroExtension);
              }
              else {
                // We don't validate absolute 64-bit addresses without an index register as this also depends
                // on the target's base address. We don't have the information to do it at this moment.
              }
            }
          }
        }

        if (indexType != RegType::kNone) {
          if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemIndexRegs, indexType)))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == RegType::kX86_Xmm) {
            opFlags |= InstDB::OpFlags::kVm32x | InstDB::OpFlags::kVm64x;
          }
          else if (indexType == RegType::kX86_Ymm) {
            opFlags |= InstDB::OpFlags::kVm32y | InstDB::OpFlags::kVm64y;
          }
          else if (indexType == RegType::kX86_Zmm) {
            opFlags |= InstDB::OpFlags::kVm32z | InstDB::OpFlags::kVm64z;
          }
          else {
            if (baseType != RegType::kNone)
              opFlags |= InstDB::OpFlags::kFlagMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == RegType::kX86_Rip && Support::test(opFlags, InstDB::OpFlags::kVmMask))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.indexId();
          if (indexId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(indexId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            combinedRegMask |= Support::bitMask(indexId);
          }
          else {
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
          }

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }

        switch (memSize) {
          case  0: opFlags |= InstDB::OpFlags::kMemUnspecified; break;
          case  1: opFlags |= InstDB::OpFlags::kMem8; break;
          case  2: opFlags |= InstDB::OpFlags::kMem16; break;
          case  4: opFlags |= InstDB::OpFlags::kMem32; break;
          case  6: opFlags |= InstDB::OpFlags::kMem48; break;
          case  8: opFlags |= InstDB::OpFlags::kMem64; break;
          case 10: opFlags |= InstDB::OpFlags::kMem80; break;
          case 16: opFlags |= InstDB::OpFlags::kMem128; break;
          case 32: opFlags |= InstDB::OpFlags::kMem256; break;
          case 64: opFlags |= InstDB::OpFlags::kMem512; break;

          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case OperandType::kImm: {
        uint64_t immValue = op.as<Imm>().valueAs<uint64_t>();

        if (int64_t(immValue) >= 0) {
          if (immValue <= 0x7u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmI4  | InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0xFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0x7Fu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0xFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0x7FFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0xFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0x7FFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0xFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0x7FFFFFFFFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64;
          else
            opFlags = InstDB::OpFlags::kImmU64;
        }
        else {
          immValue = Support::neg(immValue);
          if (immValue <= 0x8u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8 | InstDB::OpFlags::kImmI4;
          else if (immValue <= 0x80u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8;
          else if (immValue <= 0x8000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16;
          else if (immValue <= 0x80000000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32;
          else
            opFlags = InstDB::OpFlags::kImmI64;
        }
        break;
      }

      case OperandType::kLabel: {
        opFlags |= InstDB::OpFlags::kRel8 | InstDB::OpFlags::kRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    InstDB::OpSignature& oSigDst = oSigTranslated[i];
    oSigDst._flags = uint64_t(opFlags) & 0x00FFFFFFFFFFFFFFu;
    oSigDst._regMask = uint8_t(regMask & 0xFFu);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important as Assembler and Compiler may just pass
  // more operands padded with none (which means that no operand is given at that index). However, validate that there
  // are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < opCount) {
    while (--opCount > i)
      if (ASMJIT_UNLIKELY(!operands[opCount].isNone()))
        return DebugUtils::errored(kErrorInvalidInstruction);
  }

  // Validate X86 and X64 specific cases.
  if (mode == InstDB::Mode::kX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY(Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpq)))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    bool hasREX = inst.hasOption(InstOptions::kX86_Rex) || (combinedRegMask & 0xFFFFFF00u) != 0;
    if (ASMJIT_UNLIKELY(hasREX && Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpbHi)))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate Instruction Signature by Comparing Against All `iSig` Rows
  // -------------------------------------------------------------------

  const InstDB::InstSignature* iSig = InstDB::_instSignatureTable + commonInfo._iSignatureIndex;
  const InstDB::InstSignature* iEnd = iSig + commonInfo._iSignatureCount;

  if (iSig != iEnd) {
    const InstDB::OpSignature* opSignatureTable = InstDB::_opSignatureTable;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if (!iSig->supportsMode(mode))
        continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount();
      bool localImmOutOfRange = false;

      if (iSigCount == opCount) {
        for (j = 0; j < opCount; j++)
          if (!x86CheckOSig(oSigTranslated[j], iSig->opSignature(j), localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicitOpCount() == opCount) {
        uint32_t r = 0;
        for (j = 0; j < opCount && r < iSigCount; j++, r++) {
          const InstDB::OpSignature* oChk = oSigTranslated + j;
          const InstDB::OpSignature* oRef;
Next:
          oRef = opSignatureTable + iSig->opSignatureIndex(r);
          // Skip implicit operands.
          if (oRef->isImplicit()) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == opCount) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX512 Options
  // -----------------------

  const RegOnly& extraReg = inst.extraReg();

  if (Support::test(options, kAvx512Options)) {
    if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {z}.
      if (Support::test(options, InstOptions::kX86_ZMask)) {
        if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_ZMask) && !commonInfo.hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 {sae} and {er}.
      if (Support::test(options, InstOptions::kX86_SAE | InstOptions::kX86_ER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (Support::test(options, InstOptions::kX86_ER)) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
        else {
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }

        // {sae} and {er} are defined for either scalar ops or vector ops that require LL to be 10 (512-bit vector
        // operations). We don't need any more bits in the instruction database to be able to validate this, as
        // each AVX512 instruction that has broadcast is vector instruction (in this case we require zmm registers),
        // otherwise it's a scalar instruction, which is valid.
        if (commonInfo.hasAvx512B()) {
          // Supports broadcast, thus we require LL to be '10', which means there have to be ZMM registers used. We
          // don't calculate LL here, but we know that it would be '10' if there is at least one ZMM register used.

          // There is no {er}/{sae}-enabled instruction with less than two operands.
          ASMJIT_ASSERT(opCount >= 2);
          if (ASMJIT_UNLIKELY(!x86IsZmmOrM512(operands[0]) && !x86IsZmmOrM512(operands[1])))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not an AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNE prefix.
      if (Support::test(options, kAvx512Options) || !Support::test(options, kRepAny))
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate {Extra} Register
  // -------------------------

  if (extraReg.isReg()) {
    if (Support::test(options, kRepAny)) {
      // Validate REP|REPNE {cx|ecx|rcx}.
      if (ASMJIT_UNLIKELY(Support::test(iFlags, InstDB::InstFlags::kRepIgnored)))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (extraReg.isPhysReg()) {
        if (ASMJIT_UNLIKELY(extraReg.id() != Gp::kIdCx))
          return DebugUtils::errored(kErrorInvalidExtraReg);
      }

      // The type of the {...} register must match the type of the base register
      // of memory operand. So if the memory operand uses 32-bit register the
      // count register must also be 32-bit, etc...
      if (ASMJIT_UNLIKELY(!memOp || extraReg.type() != memOp->baseType()))
        return DebugUtils::errored(kErrorInvalidExtraReg);
    }
    else if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {k}.
      if (ASMJIT_UNLIKELY(extraReg.type() != RegType::kX86_KReg))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (ASMJIT_UNLIKELY(extraReg.id() == 0 || !commonInfo.hasAvx512K()))
        return DebugUtils::errored(kErrorInvalidKMaskUse);
    }
    else {
      return DebugUtils::errored(kErrorInvalidExtraReg);
    }
  }

  return kErrorOk;
}